

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O1

uint __thiscall
crnlib::dxt_image::get_block_colors
          (dxt_image *this,uint block_x,uint block_y,uint element_index,color_quad_u8 *pColors,
          uint subblock_index)

{
  char cVar1;
  byte bVar2;
  element *peVar3;
  uint uVar4;
  uint table_idx;
  long lVar5;
  uint table_idx_00;
  ulong uVar6;
  uint uVar7;
  uchar *puVar8;
  uint uVar9;
  ushort uVar10;
  uint values [8];
  uint local_48 [10];
  
  uVar9 = 0;
  uVar4 = 0;
  if (this->m_element_type[element_index] - cColorDXT1 < 4) {
    peVar3 = this->m_pElements;
    uVar7 = (block_y * this->m_blocks_x + block_x) * this->m_num_elements_per_block + element_index;
    switch(this->m_element_type[element_index]) {
    case cColorDXT1:
      uVar4 = dxt1_block::get_block_colors
                        (pColors,*(uint16 *)peVar3[uVar7].m_bytes,
                         *(uint16 *)(peVar3[uVar7].m_bytes + 2));
      return uVar4;
    case cAlphaDXT3:
      puVar8 = (pColors->field_0).c + (uint)(int)this->m_element_component_index[element_index];
      lVar5 = 0;
      do {
        *puVar8 = (uchar)lVar5;
        lVar5 = lVar5 + 0x11;
        puVar8 = puVar8 + 4;
      } while (lVar5 != 0x110);
      uVar4 = 0x10;
      break;
    case cAlphaDXT5:
      uVar4 = dxt5_block::get_block_values
                        (local_48,(uint)peVar3[uVar7].m_bytes[0],(uint)peVar3[uVar7].m_bytes[1]);
      if (uVar4 != 0) {
        cVar1 = this->m_element_component_index[element_index];
        uVar6 = 0;
        do {
          pColors[uVar6].field_0.c[(uint)(int)cVar1] = (uchar)local_48[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
      }
      break;
    case cColorETC1:
      bVar2 = peVar3[uVar7].m_bytes[3];
      table_idx = (uint)(bVar2 >> 5);
      table_idx_00 = bVar2 >> 2 & 7;
      uVar4 = uVar9;
      if ((bVar2 & 2) == 0) {
        if (subblock_index == 0) {
          uVar10 = (ushort)(peVar3[uVar7].m_bytes[0] >> 4) << 8 |
                   (ushort)(peVar3[uVar7].m_bytes[2] >> 4) | peVar3[uVar7].m_bytes[1] & 0xfff0;
        }
        else {
          uVar10 = (peVar3[uVar7].m_bytes[0] & 0xf) << 8 |
                   (ushort)(byte)(peVar3[uVar7].m_bytes[1] << 4) | peVar3[uVar7].m_bytes[2] & 0xf;
          table_idx = table_idx_00;
        }
        etc1_block::get_abs_subblock_colors(pColors,uVar10,table_idx);
      }
      else {
        uVar10 = (ushort)((peVar3[uVar7].m_bytes[0] & 0xf8) << 7) |
                 (ushort)(peVar3[uVar7].m_bytes[2] >> 3) + (peVar3[uVar7].m_bytes[1] & 0xfff8) * 4;
        if (subblock_index == 0) {
          etc1_block::get_diff_subblock_colors(pColors,uVar10,table_idx);
        }
        else {
          etc1_block::get_diff_subblock_colors
                    (pColors,uVar10,
                     (peVar3[uVar7].m_bytes[2] & 7) + (peVar3[uVar7].m_bytes[1] & 7) * 8 |
                     (ushort)((peVar3[uVar7].m_bytes[0] & 7) << 6),table_idx_00);
        }
      }
    }
  }
  return uVar4;
}

Assistant:

uint dxt_image::get_block_colors(uint block_x, uint block_y, uint element_index, color_quad_u8* pColors, uint subblock_index)
    {
        const element& block = get_element(block_x, block_y, element_index);

        switch (m_element_type[element_index])
        {
        case cColorETC1:
        {
            const etc1_block& src_block = *reinterpret_cast<const etc1_block*>(&get_element(block_x, block_y, element_index));
            const uint table_index0 = src_block.get_inten_table(0);
            const uint table_index1 = src_block.get_inten_table(1);
            if (src_block.get_diff_bit())
            {
                const uint16 base_color5 = src_block.get_base5_color();
                const uint16 delta_color3 = src_block.get_delta3_color();
                if (subblock_index)
                {
                    etc1_block::get_diff_subblock_colors(pColors, base_color5, delta_color3, table_index1);
                }
                else
                {
                    etc1_block::get_diff_subblock_colors(pColors, base_color5, table_index0);
                }
            }
            else
            {
                if (subblock_index)
                {
                    const uint16 base_color4_1 = src_block.get_base4_color(1);
                    etc1_block::get_abs_subblock_colors(pColors, base_color4_1, table_index1);
                }
                else
                {
                    const uint16 base_color4_0 = src_block.get_base4_color(0);
                    etc1_block::get_abs_subblock_colors(pColors, base_color4_0, table_index0);
                }
            }

            break;
        }
        case cColorDXT1:
        {
            const dxt1_block& block1 = *reinterpret_cast<const dxt1_block*>(&block);
            return dxt1_block::get_block_colors(pColors, static_cast<uint16>(block1.get_low_color()), static_cast<uint16>(block1.get_high_color()));
        }
        case cAlphaDXT5:
        {
            const dxt5_block& block5 = *reinterpret_cast<const dxt5_block*>(&block);

            uint values[cDXT5SelectorValues];

            const uint n = dxt5_block::get_block_values(values, block5.get_low_alpha(), block5.get_high_alpha());

            const int comp_index = m_element_component_index[element_index];
            for (uint i = 0; i < n; i++)
            {
                pColors[i][comp_index] = static_cast<uint8>(values[i]);
            }

            return n;
        }
        case cAlphaDXT3:
        {
            const int comp_index = m_element_component_index[element_index];
            for (uint i = 0; i < 16; i++)
            {
                pColors[i][comp_index] = static_cast<uint8>((i << 4) | i);
            }

            return 16;
        }
        default:
            break;
        }

        return 0;
    }